

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O2

uint32_t __thiscall absl::lts_20250127::base_internal::SpinLock::SpinLoop(SpinLock *this)

{
  uint uVar1;
  once_flag oVar2;
  uint32_t uVar3;
  int iVar4;
  bool bVar5;
  
  iVar4 = SpinLoop::adaptive_spin_count;
  if ((__atomic_base<unsigned_int>)
      SpinLoop::init_adaptive_spin_count.control_.super___atomic_base<unsigned_int>._M_i !=
      (__atomic_base<unsigned_int>)0xdd) {
    if (((((__atomic_base<unsigned_int>)
           SpinLoop::init_adaptive_spin_count.control_.super___atomic_base<unsigned_int>._M_i !=
           (__atomic_base<unsigned_int>)0x0) &&
         ((__atomic_base<unsigned_int>)
          SpinLoop::init_adaptive_spin_count.control_.super___atomic_base<unsigned_int>._M_i !=
          (__atomic_base<unsigned_int>)0xdd)) &&
        ((__atomic_base<unsigned_int>)
         SpinLoop::init_adaptive_spin_count.control_.super___atomic_base<unsigned_int>._M_i !=
         (__atomic_base<unsigned_int>)0x5a308d2)) &&
       ((__atomic_base<unsigned_int>)
        SpinLoop::init_adaptive_spin_count.control_.super___atomic_base<unsigned_int>._M_i !=
        (__atomic_base<unsigned_int>)0x65c2937b)) {
      raw_log_internal::RawLog(kFatal,"call_once.h",0xa4,"Unexpected value for control word: 0x%lx")
      ;
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/call_once.h"
                    ,0xa4,
                    "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/internal/spinlock.cc:93:62), Args = <>]"
                   );
    }
    LOCK();
    bVar5 = (__atomic_base<unsigned_int>)
            SpinLoop::init_adaptive_spin_count.control_.super___atomic_base<unsigned_int>._M_i ==
            (__atomic_base<unsigned_int>)0x0;
    if (bVar5) {
      SpinLoop::init_adaptive_spin_count.control_.super___atomic_base<unsigned_int>._M_i =
           (atomic<unsigned_int>)(__atomic_base<unsigned_int>)0x65c2937b;
    }
    UNLOCK();
    if ((bVar5) ||
       (uVar3 = SpinLockWait(&SpinLoop::init_adaptive_spin_count.control_,3,
                             (SpinLockWaitTransition *)
                             CallOnceImpl<absl::lts_20250127::base_internal::SpinLock::SpinLoop()::$_0>(std::atomic<unsigned_int>*,absl::lts_20250127::base_internal::SchedulingMode,absl::lts_20250127::base_internal::SpinLock::SpinLoop()::$_0&&)
                             ::trans,SCHEDULE_KERNEL_ONLY), iVar4 = SpinLoop::adaptive_spin_count,
       uVar3 == 0)) {
      iVar4 = NumCPUs();
      oVar2 = SpinLoop::init_adaptive_spin_count;
      SpinLoop::adaptive_spin_count = 1;
      if (1 < iVar4) {
        SpinLoop::adaptive_spin_count = 1000;
      }
      LOCK();
      SpinLoop::init_adaptive_spin_count.control_.super___atomic_base<unsigned_int>._M_i =
           (atomic<unsigned_int>)(__atomic_base<unsigned_int>)0xdd;
      UNLOCK();
      iVar4 = SpinLoop::adaptive_spin_count;
      if ((__atomic_base<unsigned_int>)oVar2.control_.super___atomic_base<unsigned_int>._M_i ==
          (__atomic_base<unsigned_int>)0x5a308d2) {
        AbslInternalSpinLockWake_lts_20250127(&SpinLoop::init_adaptive_spin_count.control_,true);
        iVar4 = SpinLoop::adaptive_spin_count;
      }
    }
  }
  do {
    uVar1 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
    if ((uVar1 & 1) == 0) {
      return uVar1;
    }
    bVar5 = 1 < iVar4;
    iVar4 = iVar4 + -1;
  } while (bVar5);
  return uVar1;
}

Assistant:

uint32_t SpinLock::SpinLoop() {
  // We are already in the slow path of SpinLock, initialize the
  // adaptive_spin_count here.
  ABSL_CONST_INIT static absl::once_flag init_adaptive_spin_count;
  ABSL_CONST_INIT static int adaptive_spin_count = 0;
  base_internal::LowLevelCallOnce(&init_adaptive_spin_count, []() {
    adaptive_spin_count = base_internal::NumCPUs() > 1 ? 1000 : 1;
  });

  int c = adaptive_spin_count;
  uint32_t lock_value;
  do {
    lock_value = lockword_.load(std::memory_order_relaxed);
  } while ((lock_value & kSpinLockHeld) != 0 && --c > 0);
  return lock_value;
}